

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::PrepareRenderbuffer
          (StorageMultisampleTest *this,RenderbufferInternalFormatConfiguration format,GLuint width,
          GLuint height,GLsizei samples)

{
  GLuint *pGVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  size_t sVar7;
  GLuint *pGVar8;
  long lVar9;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pGVar1 = this->m_fbo;
  (**(code **)(lVar6 + 0x6d0))(2,pGVar1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2154);
  pGVar8 = this->m_rbo;
  (**(code **)(lVar6 + 0x3e0))(2,pGVar8);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2157);
  lVar9 = 0;
  bVar2 = true;
  while( true ) {
    (**(code **)(lVar6 + 0x78))(0x8d40,pGVar1[lVar9]);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glBindFramebuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x215c);
    if (bVar2) {
      (**(code **)(lVar6 + 0xfb0))(*pGVar8,samples,format.internalformat,width,height);
      local_1c0.m_value = (**(code **)(lVar6 + 0x800))();
      if (local_1c0.m_value != 0) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Renderbuffer storage multisample test failed because NamedRenderbufferStorageMultisample generated "
                   ,99);
        local_1c0.m_getName = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," error value. Renderbuffers format was ",0x27);
        if (format.internalformat_name == (GLchar *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar7 = strlen(format.internalformat_name);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,format.internalformat_name,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,", samples was ",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,samples);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", width was ",0xc)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,", height was ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00aa6deb;
      }
    }
    else {
      (**(code **)(lVar6 + 0xfb0))(pGVar8[lVar9],0,format.internalformat,width,height);
      local_1c0.m_value = (**(code **)(lVar6 + 0x800))();
      if (local_1c0.m_value != 0) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Renderbuffer storage multisample test failed because NamedRenderbufferStorageMultisample generated "
                   ,99);
        local_1c0.m_getName = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," error value. Renderbuffers format was ",0x27);
        if (format.internalformat_name == (GLchar *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar7 = strlen(format.internalformat_name);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,format.internalformat_name,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,", samples was ",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", width was ",0xc)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,", height was ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00aa6deb;
      }
    }
    if (((format.hasAlphaComponent | format.hasBlueComponent |
         format.hasGreenComponent | format.hasRedComponent) & 1U) != 0) {
      (**(code **)(lVar6 + 0xf10))(pGVar1[lVar9],0x8ce0,0x8d41,pGVar8[lVar9]);
    }
    if (((undefined1  [24])format & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      (**(code **)(lVar6 + 0xf10))(pGVar1[lVar9],0x8d00,0x8d41,pGVar8[lVar9]);
    }
    if (((undefined1  [24])format & (undefined1  [24])0x10000000000) != (undefined1  [24])0x0) {
      (**(code **)(lVar6 + 0xf10))(pGVar1[lVar9],0x8d20,0x8d41,pGVar8[lVar9]);
    }
    local_1c0.m_value = (**(code **)(lVar6 + 0x170))(0x8d40);
    if (local_1c0.m_value != 0x8cd5) break;
    lVar9 = 1;
    bVar3 = !bVar2;
    bVar2 = false;
    if (bVar3) {
      return true;
    }
  }
  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Renderbuffer storage multisample test failed due to ",0x34);
  local_1c0.m_getName = glu::getFramebufferStatusName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," framebuffer status. Renderbuffers format was ",0x2e);
  if (format.internalformat_name == (GLchar *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar7 = strlen(format.internalformat_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,format.internalformat_name,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", samples was ",0xe);
  iVar4 = 0;
  if (bVar2) {
    iVar4 = samples;
  }
  std::ostream::operator<<((ostringstream *)&local_1a8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", width was ",0xc);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", height was ",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00aa6deb:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool StorageMultisampleTest::PrepareRenderbuffer(StorageMultisampleTest::RenderbufferInternalFormatConfiguration format,
												 glw::GLuint width, glw::GLuint height, glw::GLsizei samples)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(2, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.createRenderbuffers(2, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateRenderbuffers call failed.");

	for (glw::GLuint i = 0; i < 2; ++i)
	{
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

		if (i)
		{
			/* 2nd is not multisampled. */
			gl.namedRenderbufferStorageMultisample(m_rbo[i], 0, format.internalformat, width, height);

			if (glw::GLenum error = gl.getError())
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed because "
												"NamedRenderbufferStorageMultisample generated "
					<< glu::getErrorStr(error) << " error value. Renderbuffers format was "
					<< format.internalformat_name << ", samples was " << 0 << ", width was " << width << ", height was "
					<< height << "." << tcu::TestLog::EndMessage;
				return false;
			}
		}
		else
		{
			/* 1st is multisampled. */
			gl.namedRenderbufferStorageMultisample(m_rbo[i], samples, format.internalformat, width, height);

			if (glw::GLenum error = gl.getError())
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed because "
												"NamedRenderbufferStorageMultisample generated "
					<< glu::getErrorStr(error) << " error value. Renderbuffers format was "
					<< format.internalformat_name << ", samples was " << samples << ", width was " << width
					<< ", height was " << height << "." << tcu::TestLog::EndMessage;
				return false;
			}
		}

		if (format.hasRedComponent || format.hasGreenComponent || format.hasBlueComponent || format.hasAlphaComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo[i]);
		}

		if (format.hasDepthComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_rbo[i]);
		}

		if (format.hasStencilComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo[i]);
		}

		glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
		if (status != GL_FRAMEBUFFER_COMPLETE)
		{
			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed due to "
				<< glu::getFramebufferStatusStr(status) << " framebuffer status. Renderbuffers format was "
				<< format.internalformat_name << ", samples was " << (i ? 0 : samples) << ", width was " << width
				<< ", height was " << height << "." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}